

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1M2L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  pointer ppVar1;
  iterator __position;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined8 uVar33;
  double *pdVar34;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar35;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  ostream *poVar36;
  long lVar37;
  double *pdVar38;
  undefined8 *puVar39;
  char *__function;
  long lVar40;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar41;
  XprTypeNested pMVar42;
  iterator iVar43;
  double *pdVar44;
  ulong uVar45;
  byte bVar46;
  undefined4 uVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  vector<double,_std::allocator<double>_> realRoots;
  Matrix<double,_3,_1,_0,_3,_1> t;
  double tz;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  trans;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines3;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines2;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<double,_3,_3,_0,_3,_3> R;
  Matrix<double,_4,_4,_0,_4,_4> Tw;
  Matrix<double,_4,_4,_0,_4,_4> sol;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  double dStack_dc0;
  undefined1 local_da8 [56];
  double dStack_d70;
  double dStack_d60;
  double dStack_cf0;
  double dStack_cc0;
  double dStack_c70;
  double dStack_c60;
  undefined1 local_c48 [184];
  SrcXprType local_b90;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *local_b88;
  vector<double,_std::allocator<double>_> local_b80;
  double local_b68;
  double dStack_b60;
  undefined1 local_b58 [16];
  double local_b48;
  double dStack_b40;
  double local_b38;
  double dStack_b30;
  double local_b28;
  double dStack_b20;
  undefined1 local_b18 [16];
  undefined1 local_b08 [8];
  double dStack_b00;
  Matrix<double,_4,_4,_0,_4,_4> *local_af8;
  variable_if_dynamic<long,__1> avStack_af0 [2];
  XprTypeNested pMStack_ae0;
  variable_if_dynamic<long,__1> local_ad8;
  variable_if_dynamic<long,__1> vStack_ad0;
  double local_ac8;
  double dStack_ac0;
  double local_ab8;
  double dStack_ab0;
  double local_aa8;
  double dStack_aa0;
  double local_a98;
  double dStack_a90;
  double local_a68;
  double dStack_a60;
  double local_a58;
  double dStack_a50;
  undefined1 local_a48 [16];
  double local_a38;
  double dStack_a30;
  undefined1 local_a28 [16];
  double local_a18;
  double dStack_a10;
  double local_a08;
  double dStack_a00;
  double local_9f8;
  double dStack_9f0;
  undefined1 local_9e8 [80];
  long local_998;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_990;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_978;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_960;
  undefined1 local_948 [16];
  double local_938;
  double dStack_930;
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  double local_8d8;
  undefined1 local_8c8 [16];
  double local_8b8;
  double dStack_8b0;
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double dStack_890;
  undefined1 local_888 [16];
  double local_878;
  double dStack_870;
  double local_868;
  double dStack_860;
  double local_858;
  double dStack_850;
  undefined1 local_848 [16];
  double local_838;
  double dStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  double dStack_810;
  double local_808;
  double dStack_800;
  undefined1 local_7f8 [16];
  double local_7e8;
  double dStack_7e0;
  double local_7d8;
  double dStack_7d0;
  double local_7c8;
  double dStack_7c0;
  undefined1 local_7b8 [16];
  undefined1 local_7a8 [16];
  undefined1 local_798 [16];
  double local_788;
  double dStack_780;
  double local_778 [2];
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> local_768;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 local_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  undefined8 local_6f0;
  Matrix<double,_4,_4,_0,_4,_4> local_6e8;
  Matrix<double,_3,_3,_0,_3,_3> local_668;
  double dStack_620;
  double local_618;
  double dStack_610;
  double local_608;
  double dStack_600;
  double local_5f8;
  double dStack_5f0;
  double adStack_5d8 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_5c8;
  Matrix<double,_6,_6,_0,_6,_6> local_548;
  Matrix<double,_6,_6,_0,_6,_6> local_428;
  Matrix<double,_4,_4,_0,_4,_4> local_308;
  Matrix<double,_3,_1,_0,_3,_1> local_288;
  Matrix<double,_3,_1,_0,_3,_1> local_268;
  Matrix<double,_5,_1,_0,_5,_1> local_248;
  Matrix<double,_6,_1,_0,_6,_1> local_218;
  Matrix<double,_6,_1,_0,_6,_1> local_1e8;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_1b8;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_138;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_b8;
  
  bVar46 = 0;
  ppVar1 = (lCPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((lCPair->
       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == ppVar1) &&
     ((ulong)((long)(lPair->
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(lPair->
                   super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x81)) {
    poVar36 = std::operator<<((ostream *)&std::cerr,
                              "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!"
                             );
    std::endl<char,std::char_traits<char>>(poVar36);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[0] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[1] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[1];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[2] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[3];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[1];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[2];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[3];
  getPluckerCoord<double>(&local_960,&local_b8);
  ppVar1 = (lPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        8);
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x10);
  local_138.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x18);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
         m_storage;
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_138.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&(ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  getPluckerCoord<double>(&local_978,&local_138);
  ppVar1 = (lPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &ppVar1[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar1[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        8);
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar1[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x10);
  local_1b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar1[1].first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> +
        0x18);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       ppVar1[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar1[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar1[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar1[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       *(double *)
        &ppVar1[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
         m_storage;
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar1[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar1[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar1[1].second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       ppVar1[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       *(double *)
        ((long)&ppVar1[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 8);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       *(double *)
        ((long)&ppVar1[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x10);
  local_1b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       *(double *)
        ((long)&ppVar1[1].second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        + 0x18);
  getPluckerCoord<double>(&local_990,&local_1b8);
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       ((local_960.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       ((local_960.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       ((local_960.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       ((local_960.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       ((local_960.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       ((local_960.
         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       local_960.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       local_960.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       local_960.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       local_960.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       local_960.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  local_218.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       local_960.
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  getPredefinedTransformations1M1Q<double>
            ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              *)(local_9e8 + 0x40),&local_1e8,&local_218);
  lVar40 = 0x10;
  local_af8 = (Matrix<double,_4,_4,_0,_4,_4> *)(adStack_5d8 + 2);
  pdVar34 = (double *)local_9e8._64_8_;
  pMVar42 = local_af8;
  for (lVar37 = 0x10; lVar37 != 0; lVar37 = lVar37 + -1) {
    (pMVar42->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = *pdVar34;
    pdVar34 = pdVar34 + (ulong)bVar46 * -2 + 1;
    pMVar42 = (XprTypeNested)((long)pMVar42 + ((ulong)bVar46 * -2 + 1) * 8);
  }
  pdVar34 = (double *)(local_9e8._64_8_ + 0x80);
  pMVar41 = &local_308;
  for (lVar37 = 0x10; lVar37 != 0; lVar37 = lVar37 + -1) {
    (pMVar41->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = *pdVar34;
    pdVar34 = pdVar34 + (ulong)bVar46 * -2 + 1;
    pMVar41 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar41 + ((ulong)bVar46 * -2 + 1) * 8);
  }
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       1.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
       0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
       0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
       1.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
       0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
       0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe]
       = 1.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf]
       = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x15] = 1.0;
  pdVar34 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 0x16;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 1.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x23] = 1.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       1.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
       1.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[9] =
       0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[10]
       = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xb]
       = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc]
       = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd]
       = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe]
       = 1.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xf]
       = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x10] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x11] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x13] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x14] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x15] = 1.0;
  pdVar44 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 0x16;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x16] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x17] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x19] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1a] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1c] = 1.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x21] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x22] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1f] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1d] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x1e] = 0.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
  [0x23] = 1.0;
  pdVar38 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 2;
  do {
    dVar4 = *(double *)((long)adStack_5d8 + lVar40 + 8);
    ((plain_array<double,_36,_0,_16> *)(pdVar38 + -2))->array[0] =
         *(double *)((long)adStack_5d8 + lVar40);
    pdVar38[-1] = dVar4;
    *pdVar38 = *(double *)((long)adStack_5d8 + lVar40 + 0x10);
    lVar40 = lVar40 + 0x20;
    pdVar38 = pdVar38 + 6;
  } while (lVar40 != 0x70);
  lVar37 = 8;
  do {
    pdVar34[-1] = *(double *)((long)adStack_5d8 + lVar37 + 8);
    dVar4 = *(double *)((long)adStack_5d8 + lVar37 + 0x18);
    *pdVar34 = *(double *)((long)adStack_5d8 + lVar37 + 0x10);
    pdVar34[1] = dVar4;
    lVar37 = lVar37 + 0x20;
    pdVar34 = pdVar34 + 6;
  } while (lVar37 != 0x68);
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_5c8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_5c8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_268.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_5c8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_668,&local_268);
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       + 3;
  local_ad8.m_value = 0;
  vStack_ad0.m_value = 0;
  avStack_af0[0].m_value = 3;
  avStack_af0[1].m_value = 3;
  local_ac8 = 1.97626258336499e-323;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.m_value
       = 3;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.m_value
       = 3;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
  m_value = 3;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride = 6
  ;
  local_b08 = (undefined1  [8])&local_668;
  pMStack_ae0 = local_af8;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
       &local_428;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            (&local_768,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)local_b08,(assign_op<double,_double> *)&local_6e8,(type)0x0);
  lVar37 = 0x10;
  pdVar34 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
            array + 2;
  do {
    dVar4 = *(double *)
             ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar37 + -8);
    ((plain_array<double,_36,_0,_16> *)(pdVar34 + -2))->array[0] =
         *(double *)
          ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array + lVar37 + -0x10);
    pdVar34[-1] = dVar4;
    *pdVar34 = *(double *)
                ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar37);
    lVar37 = lVar37 + 0x20;
    pdVar34 = pdVar34 + 6;
  } while (lVar37 != 0x70);
  lVar37 = 8;
  do {
    pdVar44[-1] = *(double *)
                   ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar37 + -8);
    dVar4 = *(double *)
             ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar37 + 8);
    *pdVar44 = *(double *)
                ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar37);
    pdVar44[1] = dVar4;
    lVar37 = lVar37 + 0x20;
    pdVar44 = pdVar44 + 6;
  } while (lVar37 != 0x68);
  local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_288.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_668,&local_288);
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
       local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array
       + 3;
  local_ad8.m_value = 0;
  vStack_ad0.m_value = 0;
  local_af8 = &local_308;
  avStack_af0[0].m_value = 3;
  avStack_af0[1].m_value = 3;
  local_ac8 = 1.97626258336499e-323;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.m_value
       = 3;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.m_value
       = 3;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
  m_value = 3;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
  m_value = 0;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride = 6
  ;
  local_b08 = (undefined1  [8])&local_668;
  pMStack_ae0 = local_af8;
  local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
       &local_548;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            (&local_768,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)local_b08,(assign_op<double,_double> *)&local_6e8,(type)0x0);
  dVar4 = ((local_978.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  dVar5 = ((local_978.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  dVar52 = ((local_978.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  dVar58 = ((local_978.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  dVar81 = ((local_978.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  dVar31 = ((local_978.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  dVar62 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1e] * dVar31 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x18] * dVar81 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x12] * dVar58 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xc] * dVar52 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[6] * dVar5 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0] * dVar4;
  dVar65 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1f] * dVar31 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x19] * dVar81 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x13] * dVar58 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xd] * dVar52 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[7] * dVar5 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1] * dVar4;
  local_b38 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x20] * dVar31 +
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1a] * dVar81 +
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x14] * dVar58 +
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0xe] * dVar52 +
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[8] * dVar5 +
              local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[2] * dVar4;
  dVar71 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x21] * dVar31 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1b] * dVar81 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x15] * dVar58 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xf] * dVar52 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[9] * dVar5 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[3] * dVar4;
  dVar73 = dVar31 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x22] +
           dVar81 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x1c] +
           dVar58 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x16] +
           dVar52 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x10] +
           dVar5 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[10] +
           dVar4 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[4];
  local_b18._8_8_ =
       dVar31 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x23] +
       dVar81 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x1d] +
       dVar58 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x17] +
       dVar52 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x11] +
       dVar5 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0xb] +
       dVar4 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[5];
  local_b18._0_8_ = dVar73;
  dVar4 = local_978.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar5 = local_978.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar52 = local_978.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar58 = local_978.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar81 = local_978.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar31 = local_978.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  local_b48 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1e] * dVar31 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x18] * dVar81 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x12] * dVar58 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0xc] * dVar52 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[6] * dVar5 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0] * dVar4;
  dVar66 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1f] * dVar31 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x19] * dVar81 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x13] * dVar58 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xd] * dVar52 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[7] * dVar5 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1] * dVar4;
  dVar68 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x20] * dVar31 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1a] * dVar81 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x14] * dVar58 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xe] * dVar52 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[8] * dVar5 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[2] * dVar4;
  dVar72 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x21] * dVar31 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1b] * dVar81 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x15] * dVar58 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xf] * dVar52 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[9] * dVar5 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[3] * dVar4;
  dVar54 = dVar31 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x22] +
           dVar81 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x1c] +
           dVar58 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x16] +
           dVar52 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x10] +
           dVar5 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[10] +
           dVar4 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[4];
  dVar59 = dVar31 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x23] +
           dVar81 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x1d] +
           dVar58 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x17] +
           dVar52 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x11] +
           dVar5 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0xb] +
           dVar4 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[5];
  dVar4 = ((local_990.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  dVar5 = ((local_990.
            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  dVar52 = ((local_990.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  dVar58 = ((local_990.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  dVar81 = ((local_990.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  dVar31 = ((local_990.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  dVar63 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1e] * dVar31 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x18] * dVar81 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x12] * dVar58 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xc] * dVar52 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[6] * dVar5 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0] * dVar4;
  dVar67 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1f] * dVar31 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x19] * dVar81 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x13] * dVar58 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xd] * dVar52 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[7] * dVar5 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[1] * dVar4;
  dVar74 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x20] * dVar31 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1a] * dVar81 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x14] * dVar58 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xe] * dVar52 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[8] * dVar5 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[2] * dVar4;
  dVar77 = local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x21] * dVar31 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1b] * dVar81 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x15] * dVar58 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xf] * dVar52 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[9] * dVar5 +
           local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[3] * dVar4;
  dVar78 = dVar31 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x22] +
           dVar81 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x1c] +
           dVar58 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x16] +
           dVar52 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x10] +
           dVar5 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[10] +
           dVar4 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[4];
  dVar79 = dVar31 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x23] +
           dVar81 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x1d] +
           dVar58 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x17] +
           dVar52 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x11] +
           dVar5 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0xb] +
           dVar4 * local_428.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[5];
  dVar4 = local_990.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar5 = local_990.
          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar52 = local_990.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar58 = local_990.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  dVar81 = local_990.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar31 = local_990.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  local_b28 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1e] * dVar31 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x18] * dVar81 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x12] * dVar58 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0xc] * dVar52 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[6] * dVar5 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0] * dVar4;
  dStack_b20 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x1f] * dVar31 +
               local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x19] * dVar81 +
               local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0x13] * dVar58 +
               local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[0xd] * dVar52 +
               local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[7] * dVar5 +
               local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[1] * dVar4;
  dVar64 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x20] * dVar31 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x1a] * dVar81 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0x14] * dVar58 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[0xe] * dVar52 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[8] * dVar5 +
           local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
           array[2] * dVar4;
  local_878 = local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x21] * dVar31 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x1b] * dVar81 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0x15] * dVar58 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[0xf] * dVar52 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[9] * dVar5 +
              local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
              m_data.array[3] * dVar4;
  local_da8._0_8_ =
       dVar31 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x22] +
       dVar81 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x1c] +
       dVar58 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x16] +
       dVar52 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                m_data.array[0x10] +
       dVar5 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[10] +
       dVar4 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
               m_data.array[4];
  dVar82 = dVar31 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x23] +
           dVar81 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x1d] +
           dVar58 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x17] +
           dVar52 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage
                    .m_data.array[0x11] +
           dVar5 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[0xb] +
           dVar4 * local_548.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.
                   m_data.array[5];
  local_da8._8_8_ = dVar82;
  local_838 = local_b48 * dVar65 * dVar67;
  dVar4 = -(dVar65 * dVar67);
  dVar5 = dVar62 + dVar62;
  auVar8._8_4_ = SUB84(dVar5 * dVar74,0);
  auVar8._0_8_ = dVar4;
  auVar8._12_4_ = (int)((ulong)(dVar5 * dVar74) >> 0x20);
  dVar52 = dVar62 * 4.0;
  dVar23 = dVar5 * dVar67;
  local_858 = dVar66 * dVar23;
  dVar24 = dVar23 * dVar54;
  dVar58 = local_b48 * dVar52 * dVar63;
  auVar19._8_4_ = SUB84(dVar24,0);
  auVar19._0_8_ = dVar58;
  auVar19._12_4_ = (uint)((ulong)dVar24 >> 0x20) ^ 0x80000000;
  local_948._8_4_ = (int)local_b18._8_8_;
  local_948._0_8_ = local_b18._8_8_;
  local_948._12_4_ = (int)((ulong)local_b18._8_8_ >> 0x20);
  dVar48 = dVar68 * (double)local_b18._8_8_ * dVar67;
  dVar53 = dVar68 * (double)local_b18._8_8_ * -2.0 * dVar67;
  dVar81 = dVar73 + dVar73;
  dVar83 = dVar65 * 2.0;
  dVar13 = dVar65 * 4.0;
  dVar25 = dVar66 * -dVar13 * dVar78;
  dVar31 = dVar68 * (double)local_b18._8_8_ * -2.0 * dVar63;
  local_928._8_4_ = SUB84(dVar31,0);
  local_928._0_8_ = dVar25;
  local_928._12_4_ = (int)((ulong)dVar31 >> 0x20);
  dVar26 = local_b48 * dVar73 * 4.0 * dVar67;
  dVar31 = dVar59 * local_b38 * -2.0 * dVar67;
  local_798._8_4_ = SUB84(dVar31,0);
  local_798._0_8_ = dVar26;
  local_798._12_4_ = (int)((ulong)dVar31 >> 0x20);
  local_a58 = local_b48 * dVar78 * dVar83;
  dVar31 = dVar66 * dVar67 * dVar81;
  auVar9._8_4_ = SUB84(dVar31,0);
  auVar9._0_8_ = local_a58;
  auVar9._12_4_ = (int)((ulong)dVar31 >> 0x20);
  local_788 = dVar71 * -4.0 * dVar63 * dVar66;
  dStack_780 = -local_a58;
  local_778[0] = dVar72 * dVar13 * dVar67;
  dStack_820 = dVar83 * dVar67;
  dVar31 = local_878 * -(dVar13 * dVar67) * dVar66;
  dVar6 = (double)local_da8._0_8_ * dStack_820 * dVar66;
  local_7a8._8_4_ = SUB84(dVar6,0);
  local_7a8._0_8_ = dVar31;
  local_7a8._12_4_ = (int)((ulong)dVar6 >> 0x20);
  local_7d8 = dVar73 * dVar63 * dVar66 * dStack_b20;
  dStack_7d0 = -(dStack_820 * dVar66) * (double)local_da8._0_8_;
  local_7e8 = dVar62 * dVar74 * dVar66;
  local_7b8._8_4_ = SUB84(dVar65,0);
  local_7b8._0_8_ = local_7e8;
  local_7b8._12_4_ = (int)((ulong)dVar65 >> 0x20);
  dVar6 = dVar66 * dVar78 * dVar83;
  local_7c8 = dVar66 * -dVar73 * dVar67;
  dStack_7c0 = dVar54 * dStack_820;
  dStack_7e0 = -dVar6;
  local_c48._0_8_ = dVar62 * dVar79 * dVar66;
  local_c48._8_8_ = local_b38 * -2.0 * dVar63 * dVar59;
  dVar55 = local_b38 * dVar67 * dVar59;
  dVar60 = dVar83 * dVar79 * dVar66;
  dVar14 = dVar67 * dVar71 * -4.0;
  local_7f8._8_4_ = SUB84(dVar74 * dVar83,0);
  local_7f8._0_8_ = dVar14;
  local_7f8._12_4_ = (int)((ulong)(dVar74 * dVar83) >> 0x20);
  dVar7 = dVar63 * dVar83;
  local_888._8_4_ = SUB84(dVar7,0);
  local_888._0_8_ = dVar77 * dVar52;
  local_888._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar2._8_4_ = SUB84(dStack_820,0);
  auVar2._0_8_ = dVar7;
  auVar2._12_4_ = (int)((ulong)dStack_820 >> 0x20);
  dVar69 = dVar71 + dVar71;
  dVar56 = local_b48 * dVar77 * dVar83;
  dStack_800 = dVar77 * dVar83 * dVar66;
  dVar57 = local_b48 * dVar69 * dVar63;
  local_808 = -dVar57;
  dVar15 = -dVar62;
  local_818 = dVar13 * dVar63 * dVar66;
  dStack_810 = dVar67 * dVar81 * local_b48;
  local_938 = dVar78 * dVar15 * dVar66;
  dStack_930 = dVar63 * dVar81 * local_b48;
  dVar51 = dVar54 * dVar63 * dVar65;
  dVar17 = dVar66 * dVar63 * dVar81;
  local_848._8_4_ = SUB84(dVar17,0);
  local_848._0_8_ = dVar51;
  local_848._12_4_ = (int)((ulong)dVar17 >> 0x20);
  local_8c8._8_4_ = SUB84(dVar71,0);
  local_8c8._0_8_ = -dVar71 * dVar67;
  local_8c8._12_4_ = (uint)((ulong)dVar71 >> 0x20) ^ 0x80000000;
  local_8a8 = dVar72 * dVar67 * dVar15;
  local_828 = dVar13 * dVar63 * dVar72;
  dStack_820 = dStack_820 * dVar72;
  dStack_8a0 = -dStack_820;
  dStack_830 = -dStack_810;
  dVar75 = dVar63 * dVar5;
  local_898 = dVar71 * dVar63;
  auVar20._8_4_ = SUB84(dVar65 * dVar79,0);
  auVar20._0_8_ = dVar62 * dVar78;
  auVar20._12_4_ = (int)((ulong)(dVar65 * dVar79) >> 0x20);
  dVar27 = -dVar52 * dVar67;
  dVar32 = dVar5 * dVar78;
  auVar21._8_4_ = SUB84(dVar32,0);
  auVar21._0_8_ = dVar27;
  auVar21._12_4_ = (int)((ulong)dVar32 >> 0x20);
  dStack_d60 = auVar8._8_8_;
  dVar4 = dVar4 * dVar54;
  auVar10._8_4_ = SUB84(dStack_d60 * local_b48,0);
  auVar10._0_8_ = dVar4;
  auVar10._12_4_ = (int)((ulong)(dStack_d60 * local_b48) >> 0x20);
  dVar16 = dVar72 * dVar75;
  dVar18 = dVar66 * dVar77 * dVar5;
  dVar28 = local_b48 * dVar75 * local_878;
  dVar29 = dVar77 * dVar5 * local_b48 * local_b28;
  local_868 = dVar65 * dVar78 * local_b48;
  dStack_860 = dVar5 * dVar79 * local_b48;
  dStack_dc0 = auVar2._8_8_;
  dVar84 = dVar7 * local_b48;
  dStack_dc0 = dStack_dc0 * local_b48;
  local_8b8 = dVar67 * dVar15 * dVar66;
  dStack_8b0 = dVar69 * dVar67 * dVar66;
  dVar57 = dVar57 * local_b28;
  dVar30 = dVar66 * dVar75 * (double)local_da8._0_8_;
  dVar76 = dVar75 * dVar54 * dStack_b20;
  dVar49 = local_b48 * dVar23 * (double)local_da8._0_8_;
  dStack_850 = -dStack_8b0;
  dStack_b60 = dStack_b20;
  local_b68 = dStack_b20;
  dVar50 = dVar72 * dVar23 * dStack_b20;
  dStack_c70 = auVar21._8_8_;
  dStack_c70 = dVar66 * dStack_c70;
  auVar22._8_4_ = SUB84(local_b28,0);
  auVar22._0_8_ = local_da8._0_8_;
  auVar22._12_4_ = (int)((ulong)local_b28 >> 0x20);
  dStack_a00 = auVar19._8_8_;
  dVar61 = dStack_a00 * local_b28;
  dStack_a00 = -dStack_dc0;
  local_a08 = -dVar84;
  dVar70 = -((double)local_888._8_8_ * dVar54);
  dStack_a10 = local_b28;
  local_a18 = local_b28;
  dVar80 = -dVar56;
  dVar79 = dVar69 * dVar67 * local_b48;
  dStack_9f0 = dVar69 * dVar63 * dVar66;
  dStack_cf0 = auVar22._8_8_;
  local_a38 = local_938 * dStack_b20 +
              local_8b8 * (double)local_da8._0_8_ +
              -dVar71 * dVar67 * local_b48 * local_b28 +
              local_898 * local_b48 * dStack_b20 +
              dVar65 * dVar77 * local_b48 * local_b28 +
              local_878 * local_b48 * dVar63 * dVar65 +
              dVar77 * dVar15 * dVar66 * local_b28 +
              local_8a8 * local_b28 +
              dVar72 * dVar62 * dVar63 * dStack_b20 + -(dVar62 * dVar63) * dVar66 * local_878;
  dStack_a30 = dStack_930 * dStack_b20 +
               dStack_8b0 * dStack_cf0 +
               dVar79 * dStack_b20 +
               -dStack_9f0 * dStack_b20 +
               local_a58 * local_b28 +
               local_b28 * -dStack_800 +
               dVar80 * dStack_b20 +
               dStack_8a0 * local_b28 +
               dStack_dc0 * local_878 +
               (double)local_888._8_8_ * dVar54 * local_b28 +
               dVar72 * (double)local_888._8_8_ * dStack_b20 +
               ((-dVar84 * (double)local_da8._0_8_ +
                (((dVar18 * dStack_b20 +
                  dVar24 * local_b28 +
                  ((((((dVar16 * local_b28 - dVar28) - dVar29) + dVar57 + dVar30) - dVar76) - dVar49
                   ) - local_858 * local_878) + dVar50) - dVar32 * local_b48 * dStack_b20) -
                dStack_c70 * local_b28)) - dVar66 * dVar7 * local_878);
  uVar47 = (undefined4)((ulong)dVar64 >> 0x20);
  auVar3._8_4_ = SUB84(dVar64,0);
  auVar3._0_8_ = dStack_b20;
  auVar3._12_4_ = uVar47;
  local_a28._8_4_ = SUB84(dVar82,0);
  local_a28._0_8_ = dStack_b20;
  local_a28._12_4_ = (int)((ulong)dVar82 >> 0x20);
  local_b58 = local_da8._0_16_;
  auVar11._8_4_ = SUB84(dVar64,0);
  auVar11._0_8_ = local_da8._0_8_;
  auVar11._12_4_ = uVar47;
  dVar24 = dVar13 * dVar77 * dVar66;
  auVar12._8_4_ = (int)local_c48._8_8_;
  auVar12._0_8_ = dVar24;
  auVar12._12_4_ = (int)((ulong)local_c48._8_8_ >> 0x20);
  local_a48 = local_c48._0_16_;
  dVar13 = auVar20._8_8_ * local_b48;
  dVar17 = dVar65 * dVar74 * local_b48;
  dStack_cc0 = auVar9._8_8_;
  local_a68 = dVar48 * local_b28;
  dStack_a60 = dVar53 * dStack_b20;
  local_9f8 = dVar79 * local_b28;
  dStack_9f0 = dStack_9f0 * dStack_b20;
  dStack_a50 = dStack_cc0;
  dStack_d60 = auVar10._8_8_;
  dStack_c60 = auVar3._8_8_;
  dVar67 = local_7c8 * local_b28 +
           local_868 * dStack_b20 +
           local_b28 * dVar4 + local_838 * (double)local_da8._0_8_ + dVar51 * dStack_b20 + local_a38
           + local_7d8;
  dVar51 = local_b38 * dVar63 * dVar59;
  dVar4 = (double)local_b18._8_8_ * dVar63 * dVar68;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
       local_a68 +
       -dVar4 * dStack_b20 +
       local_b28 * dVar55 +
       -dVar51 * dStack_b20 +
       -dVar13 * dVar64 +
       -dVar17 * dVar82 + (double)local_c48._0_8_ * dVar64 + local_7e8 * dVar82 + dVar67;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
       dStack_a60 +
       (double)local_798._8_8_ * dStack_b20 +
       dVar64 * dVar60 +
       (double)local_7f8._8_8_ * dVar66 * (double)local_a28._8_8_ +
       (double)local_928._8_8_ * local_b28 +
       dStack_cc0 * dStack_b20 +
       (double)local_c48._8_8_ * local_b28 +
       dStack_7e0 * dStack_b20 +
       dStack_7c0 * dStack_b20 +
       dStack_860 * dStack_c60 +
       dVar82 * dStack_d60 +
       dStack_830 * dStack_cf0 + (double)local_848._8_8_ * local_b28 + dStack_a30 + dStack_7d0;
  local_da8._8_8_ = auVar11._8_8_;
  dStack_d70 = auVar12._8_8_;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
       dStack_cc0 * local_b28 +
       dVar26 * dStack_b20 +
       -(double)local_848._8_8_ * dStack_b20 +
       dVar14 * dVar66 * dStack_b20 +
       local_b28 * dVar25 +
       ((dVar24 * dStack_b20 +
        dStack_7c0 * local_b28 +
        local_778[0] * dStack_b20 +
        dVar31 + (double)local_da8._0_8_ * -dStack_dc0 +
                 dVar70 * dStack_b20 +
                 (double)local_da8._0_8_ * local_818 +
                 dStack_c70 * dStack_b20 +
                 dVar27 * dVar54 * dStack_b20 +
                 local_858 * (double)local_da8._0_8_ +
                 dVar73 * 4.0 * dVar63 * local_b48 * local_b28 +
                 local_9f8 +
                 local_788 * local_b28 +
                 local_808 * dStack_b20 +
                 dVar80 * local_b28 +
                 local_828 * local_b28 +
                 ((dVar78 * -dVar52 * local_b48 * local_b28 +
                  dVar18 * local_b28 +
                  local_b48 * dVar77 * dVar52 * dStack_b20 +
                  local_b28 * dVar72 * dVar23 +
                  local_b48 * dVar27 * local_878 +
                  -(dVar52 * dVar63) * dVar54 * local_b28 +
                  ((dVar58 * (double)local_da8._0_8_ + dVar66 * dVar75 * local_878) -
                  dVar16 * dStack_b20)) - dVar84 * local_878)) - local_a58 * dStack_b20);
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       dVar53 * dStack_b20 +
       (double)local_798._8_8_ * dStack_b20 +
       dVar60 * dStack_c60 +
       (double)local_7f8._8_8_ * dVar66 * (double)local_a28._8_8_ +
       local_b28 * (double)local_928._8_8_ +
       ((dStack_d70 * local_b28 +
        dVar6 * dStack_b20 +
        -dStack_7c0 * dStack_b20 +
        (double)local_7a8._8_8_ +
        (double)local_da8._8_8_ * dStack_860 +
        dStack_d60 * (double)local_a28._8_8_ +
        dStack_cf0 * dStack_810 +
        -(double)local_848._8_8_ * local_b28 +
        -dStack_930 * dStack_b20 +
        dStack_850 * dStack_cf0 +
        -dVar79 * dStack_b20 +
        dStack_9f0 +
        dStack_780 * local_b28 +
        dStack_800 * local_b28 +
        dVar56 * dStack_b20 +
        dStack_820 * local_b28 +
        ((dVar70 * local_b28 +
         -(dVar72 * (double)local_888._8_8_) * dStack_b20 +
         dVar66 * dVar7 * local_878 +
         (double)local_da8._0_8_ * dVar84 +
         dStack_c70 * local_b28 +
         dVar32 * local_b48 * dStack_b20 +
         ((dVar61 + (((((-dVar16 * local_b28 + dVar28 + dVar29) - dVar57) - dVar30) + dVar76 +
                      dVar49 + local_858 * local_878) - dVar50)) - dVar18 * dStack_b20)) -
        dStack_dc0 * local_878)) - dStack_cc0 * dStack_b20);
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       (dVar4 * dStack_b20 +
       ((dVar51 * dStack_b20 +
        dVar13 * dVar64 +
        dVar17 * dVar82 + ((dVar67 - local_7e8 * dVar82) - (double)local_c48._0_8_ * dVar64)) -
       dVar55 * local_b28)) - dVar48 * local_b28;
  dStack_b40 = dVar66;
  dStack_b30 = dVar71;
  dStack_890 = dVar71;
  dStack_870 = local_878;
  local_778[1] = dVar72;
  o4_roots<double>(&local_b80,&local_248);
  if (local_b80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_b80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    dVar71 = dVar71 * local_b48;
    uVar47 = local_b18._12_4_;
    dVar59 = dVar59 * local_b38;
    dVar68 = dVar68 * (double)local_948._0_8_;
    local_b18._8_4_ = local_b18._8_4_;
    local_b18._0_8_ =
         local_b18._0_8_ * dVar66 + dVar65 * dVar54 + dVar62 * dVar72 + dVar71 + dVar59 + dVar68;
    local_b18._12_4_ = uVar47;
    dVar52 = -dVar81 * local_b48;
    dVar58 = dVar65 * local_b48;
    dVar81 = -dVar65 * local_b48;
    dVar4 = dVar5 * local_b48;
    uVar45 = 0;
    do {
      dVar31 = local_b80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar45];
      local_9e8._56_8_ =
           -(dVar52 * dVar31 +
            dVar69 * dVar66 * dVar31 +
            -dVar83 * dVar72 * dVar31 +
            dVar5 * dVar54 * dVar31 +
            dVar68 * dVar31 * dVar31 +
            dVar59 * dVar31 * dVar31 +
            -dVar73 * dVar66 * dVar31 * dVar31 +
            dVar54 * -dVar65 * dVar31 * dVar31 +
            dVar31 * -dVar71 * dVar31 + dVar15 * dVar72 * dVar31 * dVar31 + (double)local_b18._0_8_)
           / (dVar83 * dVar66 * dVar31 +
             dVar4 * dVar31 +
             dVar81 * dVar31 * dVar31 +
             dVar62 * dVar66 * dVar31 * dVar31 + (dVar58 - dVar62 * dVar66));
      local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = dVar31 * -2.0;
      dVar6 = 1.0 - dVar31 * dVar31;
      local_b08 = (undefined1  [8])local_918;
      dStack_b00 = 0.0;
      local_af8 = (Matrix<double,_4,_4,_0,_4,_4> *)0x1;
      avStack_af0[0].m_value = 1;
      local_918._0_8_ = dVar6;
      pCVar35 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_b08,
                           (Scalar *)&local_668);
      local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
           (PointerType)0x0;
      pCVar35 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar35,(Scalar *)&local_768);
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = dVar31 + dVar31;
      pCVar35 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar35,(Scalar *)&local_6e8);
      local_9e8._0_8_ = dVar6;
      pCVar35 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar35,(Scalar *)local_9e8);
      local_b90.m_xpr = (XprTypeNested)0x0;
      pCVar35 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar35,(Scalar *)&local_b90);
      local_9e8._48_8_ = 0.0;
      pCVar35 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar35,(Scalar *)(local_9e8 + 0x30));
      local_9e8._40_8_ = 0.0;
      pCVar35 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                          (pCVar35,(Scalar *)(local_9e8 + 0x28));
      dVar31 = dVar31 * dVar31 + 1.0;
      local_9e8._32_8_ = dVar31;
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                (pCVar35,(Scalar *)(local_9e8 + 0x20));
      if ((avStack_af0[0].m_value + (long)dStack_b00 != 3) ||
         (local_af8 != (Matrix<double,_4,_4,_0,_4,_4> *)0x3)) {
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
        ;
LAB_001a8c08:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
      }
      dVar31 = 1.0 / dVar31;
      dVar6 = (double)local_918._8_8_ * dVar31;
      local_918._8_4_ = SUB84(dVar6,0);
      local_918._0_8_ = (double)local_918._0_8_ * dVar31;
      local_918._12_4_ = (int)((ulong)dVar6 >> 0x20);
      dVar6 = (double)local_908._8_8_ * dVar31;
      local_908._8_4_ = SUB84(dVar6,0);
      local_908._0_8_ = (double)local_908._0_8_ * dVar31;
      local_908._12_4_ = (int)((ulong)dVar6 >> 0x20);
      dVar6 = (double)local_8f8._8_8_ * dVar31;
      local_8f8._8_4_ = SUB84(dVar6,0);
      local_8f8._0_8_ = (double)local_8f8._0_8_ * dVar31;
      local_8f8._12_4_ = (int)((ulong)dVar6 >> 0x20);
      dVar6 = dVar31 * (double)local_8e8._8_8_;
      local_8e8._8_4_ = SUB84(dVar6,0);
      local_8e8._0_8_ = dVar31 * (double)local_8e8._0_8_;
      local_8e8._12_4_ = (int)((ulong)dVar6 >> 0x20);
      local_8d8 = dVar31 * local_8d8;
      local_b08 = (undefined1  [8])local_9e8;
      dStack_b00 = 0.0;
      local_af8 = (Matrix<double,_4,_4,_0,_4,_4> *)0x1;
      avStack_af0[0].m_value = 1;
      local_9e8._0_8_ = 0.0;
      local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 0.0;
      this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b08,
                        (Scalar *)&local_668);
      Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                (this,(Scalar *)(local_9e8 + 0x38));
      if ((avStack_af0[0].m_value + (long)dStack_b00 != 3) ||
         (local_af8 != (Matrix<double,_4,_4,_0,_4,_4> *)0x1)) {
        __function = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
        ;
        goto LAB_001a8c08;
      }
      local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_data =
           (double *)0x3ff0000000000000;
      local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_xpr =
           (Matrix<double,_6,_6,_0,_6,_6> *)0x0;
      local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_rows.
      m_value = 0;
      local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>.m_cols.
      m_value = 0;
      local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_startCol.
      m_value = 0x3ff0000000000000;
      local_728 = 0;
      uStack_720 = 0;
      local_768.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.m_outerStride
           = 0;
      uStack_730 = 0;
      local_718 = 0x3ff0000000000000;
      local_710 = 0;
      local_6f0 = 0x3ff0000000000000;
      lVar37 = 0x10;
      puVar39 = (undefined8 *)local_908;
      do {
        uVar33 = puVar39[-1];
        *(undefined8 *)((long)local_778 + lVar37) = puVar39[-2];
        *(undefined8 *)((long)local_778 + lVar37 + 8) = uVar33;
        *(undefined8 *)
         ((long)&local_768.
                 super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                 .m_data + lVar37) = *puVar39;
        puVar39 = puVar39 + 3;
        lVar37 = lVar37 + 0x20;
      } while (lVar37 != 0x70);
      local_708 = (double)local_9e8._0_8_;
      dStack_700 = (double)local_9e8._8_8_;
      local_6f8 = (double)local_9e8._16_8_;
      local_b90.m_xpr = &local_308;
      local_b88 = &local_768;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_4,_4,_0,_4,_4> *)local_b08,&local_b90,
            (assign_op<double,_double> *)&local_668);
      lVar37 = 0;
      do {
        dVar31 = *(double *)
                  ((long)&(local_b88->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_data + lVar37);
        dVar6 = *(double *)
                 ((long)&(local_b88->
                         super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                         ).
                         super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                         .m_rows.m_value + lVar37);
        dVar13 = *(double *)
                  ((long)&(local_b88->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false>,_0>
                          .m_cols.m_value + lVar37);
        dVar17 = *(double *)
                  ((long)&(local_b88->
                          super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false,_true>
                          .m_xpr + lVar37);
        *(double *)
         ((long)local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar37) =
             local_aa8 * dVar17 +
             local_ac8 * dVar13 +
             (double)avStack_af0[1].m_value * dVar6 + (double)local_b08 * dVar31;
        *(double *)
         ((long)local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar37 + 8) =
             dStack_aa0 * dVar17 +
             dStack_ac0 * dVar13 + (double)pMStack_ae0 * dVar6 + dStack_b00 * dVar31;
        *(double *)
         ((long)local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar37 + 0x10) =
             dVar17 * local_a98 +
             dVar13 * local_ab8 + dVar6 * (double)local_ad8.m_value + dVar31 * (double)local_af8;
        *(double *)
         ((long)local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + lVar37 + 0x18) =
             dVar17 * dStack_a90 +
             dVar13 * dStack_ab0 +
             dVar6 * (double)vStack_ad0.m_value + dVar31 * (double)avStack_af0[0].m_value;
        lVar37 = lVar37 + 0x20;
      } while (lVar37 != 0x80);
      lVar37 = 0;
      do {
        dVar31 = *(double *)((long)adStack_5d8 + lVar37 + 0x10);
        dVar6 = *(double *)((long)adStack_5d8 + lVar37 + 0x18);
        dVar13 = *(double *)((long)adStack_5d8 + lVar37 + 0x20);
        dVar17 = *(double *)((long)adStack_5d8 + lVar37 + 0x28);
        *(double *)(local_b08 + lVar37) =
             local_608 * dVar17 +
             local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * dVar13 +
             local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] * dVar6 +
             local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] * dVar31;
        *(double *)((long)&dStack_b00 + lVar37) =
             dStack_600 * dVar17 +
             dStack_620 * dVar13 +
             local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * dVar6 +
             local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] * dVar31;
        *(double *)((long)&avStack_af0[-1].m_value + lVar37) =
             dVar17 * local_5f8 +
             dVar13 * local_618 +
             dVar6 * local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[6] +
             dVar31 * local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2];
        *(double *)((long)&avStack_af0[0].m_value + lVar37) =
             dVar17 * dStack_5f0 +
             dVar13 * dStack_610 +
             dVar6 * local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[7] +
             dVar31 * local_668.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3];
        lVar37 = lVar37 + 0x20;
      } while (lVar37 != 0x80);
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_b08;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [1] = dStack_b00;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [2] = (double)local_af8;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = (double)avStack_af0[0].m_value;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [4] = (double)avStack_af0[1].m_value;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [5] = (double)pMStack_ae0;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [6] = (double)local_ad8.m_value;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = (double)vStack_ad0.m_value;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [8] = local_ac8;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [9] = dStack_ac0;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [10] = local_ab8;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = dStack_ab0;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = local_aa8;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = dStack_aa0;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = local_a98;
      local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = dStack_a90;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                  ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                    *)__return_storage_ptr__,__position,&local_6e8);
      }
      else {
        pMVar41 = &local_6e8;
        iVar43._M_current = __position._M_current;
        for (lVar37 = 0x10; lVar37 != 0; lVar37 = lVar37 + -1) {
          ((iVar43._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
          m_storage.m_data.array[0] =
               (pMVar41->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
               m_data.array[0];
          pMVar41 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar41 + ((ulong)bVar46 * -2 + 1) * 8);
          iVar43._M_current =
               (Matrix<double,_4,_4,_0,_4,_4> *)
               ((long)iVar43._M_current + ((ulong)bVar46 * -2 + 1) * 8);
        }
        (__return_storage_ptr__->
        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar45 = uVar45 + 1;
    } while (uVar45 < (ulong)((long)local_b80.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b80.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_b80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((double *)local_9e8._64_8_ != (double *)0x0) {
    operator_delete((void *)local_9e8._64_8_,local_998 - local_9e8._64_8_);
  }
  if (local_990.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_990.
                    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_990.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_990.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_978.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_978.
                    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_978.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_978.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_960.
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_960.
                    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_960.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_960.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M2L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){
	
	// check input vectors size
	if(lCPair.size() < 1 && lPair.size() < 2){
		std::cerr << "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;

	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines2 = getPluckerCoord(lPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines3 = getPluckerCoord(lPair[1]);
	

	// move frames to first line and z axis with its direction
	std::vector<Eigen::Matrix<floatPrec,4,4>> trans = getPredefinedTransformations1M1Q(lines1[0],lines1[1]);
	Eigen::Matrix<floatPrec,4,4> TU1 = trans[0], TU2 = trans[1];
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform lines to new frame
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,6,1> lU3 = TUL1*lines2[0];
	Eigen::Matrix<floatPrec,6,1> lU4 = TUL2*lines2[1];
	Eigen::Matrix<floatPrec,6,1> lU5 = TUL1*lines3[0];
	Eigen::Matrix<floatPrec,6,1> lU6 = TUL2*lines3[1];

	// define coeffs
	floatPrec l11 = lU3(0),l12 = lU3(1),l13 = lU3(2),l14 = lU3(3),l15 = lU3(4),l16 = lU3(5);
	floatPrec l21 = lU5(0),l22 = lU5(1),l23 = lU5(2),l24 = lU5(3),l25 = lU5(4),l26 = lU5(5);
	floatPrec m11 = lU4(0),m12 = lU4(1),m13 = lU4(2),m14 = lU4(3),m15 = lU4(4),m16 = lU4(5);
	floatPrec m21 = lU6(0),m22 = lU6(1),m23 = lU6(2),m24 = lU6(3),m25 = lU6(4),m26 = lU6(5);

	floatPrec a = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22     + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 + l11*l23*m12*m26 + l11*l26*m12*m23 - l12*l23*m11*m26 - l12*l26*m11*m23 - l13*l21*m16*m22 + l13*l22*m16*m21 - l16*l21*m13*m22 + l16*l22*m13*m21;
	floatPrec b = 2*l11*l21*m14*m21 - 2*l11*l21*m11*m24 - 2*l11*l24*m11*m21 + 2*l14*l21*m11*m21 + 2*l11*l21*m12*m25 - 2*l11*l21*m15*m22 - 2*l11*l22*m11*m25 - 2*l11*l22*m12*m24 + 2*l11*l22*m14*m22 + 2*l11*l22*m15*m21 + 2*l11*l24*m12*m22 - 2*l11*l25*m11*m22 - 2*l11*l25*m12*m21 - 2*l12*l21*m11*m25 - 2*l12*l21*m12*m24 + 2*l12*l21*m14*m22 + 2*l12*l21*m15*m21 + 2*l12*l22*m11*m24 - 2*l12*l22*m14*m21 - 2*l12*l24*m11*m22 - 2*l12*l24*m12*m21 + 2*l12*l25*m11*m21 - 2*l14*l21*m12*m22 + 2*l14*l22*m11*m22 + 2*l14*l22*m12*m21 + 2*l15*l21*m11*m22 + 2*l15*l21*m12*m21 - 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 - 2*l12*l22*m12*m25 + 2*l12*l22*m15*m22 - 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 + 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec c = 4*l11*l21*m11*m25 + 2*l11*l21*m12*m24 - 2*l11*l21*m14*m22 - 4*l11*l21*m15*m21 - 4*l11*l22*m11*m24 + 2*l11*l22*m14*m21 + 4*l11*l24*m11*m22 + 2*l11*l24*m12*m21 - 4*l11*l25*m11*m21 - 2*l12*l21*m11*m24 + 4*l12*l21*m14*m21 - 2*l12*l24*m11*m21 - 2*l14*l21*m11*m22 - 4*l14*l21*m12*m21 + 2*l14*l22*m11*m21 + 4*l15*l21*m11*m21 + 2*l11*l22*m12*m25 - 4*l11*l22*m15*m22 + 2*l11*l25*m12*m22 + 4*l12*l21*m12*m25 - 2*l12*l21*m15*m22 - 2*l12*l22*m11*m25 - 4*l12*l22*m12*m24 + 4*l12*l22*m14*m22 + 2*l12*l22*m15*m21 + 4*l12*l24*m12*m22 - 2*l12*l25*m11*m22 - 4*l12*l25*m12*m21 - 4*l14*l22*m12*m22 - 2*l15*l21*m12*m22 + 4*l15*l22*m11*m22 + 2*l15*l22*m12*m21; 
	floatPrec d = 2*l11*l21*m11*m24 - 2*l11*l21*m14*m21 + 2*l11*l24*m11*m21 - 2*l14*l21*m11*m21 - 2*l11*l21*m12*m25 + 2*l11*l21*m15*m22 + 2*l11*l22*m11*m25 + 2*l11*l22*m12*m24 - 2*l11*l22*m14*m22 - 2*l11*l22*m15*m21 - 2*l11*l24*m12*m22 + 2*l11*l25*m11*m22 + 2*l11*l25*m12*m21 + 2*l12*l21*m11*m25 + 2*l12*l21*m12*m24 - 2*l12*l21*m14*m22 - 2*l12*l21*m15*m21 - 2*l12*l22*m11*m24 + 2*l12*l22*m14*m21 + 2*l12*l24*m11*m22 + 2*l12*l24*m12*m21 - 2*l12*l25*m11*m21 + 2*l14*l21*m12*m22 - 2*l14*l22*m11*m22 - 2*l14*l22*m12*m21 - 2*l15*l21*m11*m22 - 2*l15*l21*m12*m21 + 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 + 2*l12*l22*m12*m25 - 2*l12*l22*m15*m22 + 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 - 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec e = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22 + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 - l11*l23*m12*m26 - l11*l26*m12*m23 + l12*l23*m11*m26 + l12*l26*m11*m23 + l13*l21*m16*m22 - l13*l22*m16*m21 + l16*l21*m13*m22 - l16*l22*m13*m21;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = a;
	factors(1, 0) = b;
	factors(2, 0) = c;
	factors(3, 0) = d;
	factors(4, 0) = e;
	vector<floatPrec> realRoots = o4_roots(factors);
	for(size_t iter = 0; iter < realRoots.size(); iter++){
		floatPrec s = realRoots[iter];
		
		floatPrec tz = -(l11*m14 + l14*m11 + l12*m15 + l15*m12 + l13*m16 + l16*m13 - l11*m14*s*s - l14*m11*s*s - l12*m15*s*s - l15*m12*s*s + l13*m16*s*s + l16*m13*s*s + 2*l11*m15*s - 2*l12*m14*s + 2*l14*m12*s - 2*l15*m11*s)/(l12*m11 - l11*m12 + l11*m12*s*s - l12*m11*s*s + 2*l11*m11*s + 2*l12*m12*s);

		Eigen::Matrix<floatPrec,3,3> R;
		R << 1-s*s, -2*s, 0, 2*s, 1-s*s, 0, 0, 0, 1+s*s;
		R = 1/(1+s*s)*R;
		Eigen::Matrix<floatPrec,3,1> t;
		t << 0,0,tz;
		Eigen::Matrix<floatPrec,4,4> Tw = Eigen::Matrix<floatPrec,4,4>::Identity(), sol;
		Tw.topLeftCorner(3,3) = R;
		Tw.topRightCorner(3,1) = t;
		sol = TU2.inverse()*Tw*TU1;
		out.push_back(sol);
	}

	return out;
}